

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

void __thiscall
Inline::FillInlineesDataArrayUsingFixedMethods
          (Inline *this,FunctionJITTimeInfo *inlineeJitTimeData,
          FunctionJITTimeInfo **inlineesDataArray,uint inlineesDataArrayLength,
          FixedFieldInfo *fixedFieldInfoArray,uint16 cachedFixedInlineeCount)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  JITTimeFunctionBody *this_00;
  intptr_t iVar6;
  FunctionJITTimeInfo *pFVar7;
  intptr_t iVar8;
  char16 *pcVar9;
  char16 *pcVar10;
  ulong uVar11;
  undefined2 in_register_0000008a;
  FixedFieldInfo *this_01;
  wchar local_b8 [4];
  char16 debugStringBuffer [42];
  
  if (inlineesDataArrayLength < CONCAT22(in_register_0000008a,cachedFixedInlineeCount)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x2aa,"(cachedFixedInlineeCount <= inlineesDataArrayLength)",
                       "cachedFixedInlineeCount <= inlineesDataArrayLength");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  if (inlineeJitTimeData != (FunctionJITTimeInfo *)0x0) {
    do {
      bVar2 = FunctionJITTimeInfo::HasBody(inlineeJitTimeData);
      if (bVar2) {
        this_00 = FunctionJITTimeInfo::GetBody(inlineeJitTimeData);
        uVar3 = FunctionJITTimeInfo::GetSourceContextId(inlineeJitTimeData);
        uVar4 = FunctionJITTimeInfo::GetLocalFunctionId(inlineeJitTimeData);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,PolymorphicInlinePhase,uVar3,uVar4);
        if (!bVar2) {
          uVar3 = FunctionJITTimeInfo::GetSourceContextId(inlineeJitTimeData);
          uVar4 = FunctionJITTimeInfo::GetLocalFunctionId(inlineeJitTimeData);
          bVar2 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_015a4e90,PolymorphicInlineFixedMethodsPhase,uVar3,uVar4)
          ;
          if (!bVar2) {
            iVar6 = FunctionJITTimeInfo::GetFunctionInfoAddr(inlineeJitTimeData);
            pFVar7 = FunctionJITTimeInfo::GetJitTimeDataFromFunctionInfoAddr
                               (inlineeJitTimeData,iVar6);
            if (pFVar7 == (FunctionJITTimeInfo *)0x0) {
              bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,PolymorphicInlinePhase);
              if (bVar2) {
                pcVar9 = JITTimeFunctionBody::GetDisplayName(this_00);
                pcVar10 = FunctionJITTimeInfo::GetDebugNumberSet
                                    (inlineeJitTimeData,(wchar (*) [42])local_b8);
                Output::Print(L"INLINING (Polymorphic): Missing jit time data skipped inlinee\tInlinee: %s (%s)\n"
                              ,pcVar9,pcVar10);
                Output::Flush();
              }
            }
            else if (cachedFixedInlineeCount != 0) {
              uVar11 = 0;
              this_01 = fixedFieldInfoArray;
              do {
                iVar6 = FunctionJITTimeInfo::GetFunctionInfoAddr(inlineeJitTimeData);
                iVar8 = FixedFieldInfo::GetFuncInfoAddr(this_01);
                if (iVar6 == iVar8) {
                  iVar6 = FunctionJITTimeInfo::GetFunctionInfoAddr(inlineeJitTimeData);
                  pFVar7 = FunctionJITTimeInfo::GetJitTimeDataFromFunctionInfoAddr
                                     (inlineeJitTimeData,iVar6);
                  inlineesDataArray[uVar11] = pFVar7;
                  break;
                }
                uVar11 = uVar11 + 1;
                this_01 = this_01 + 1;
              } while (cachedFixedInlineeCount != uVar11);
            }
          }
        }
      }
      inlineeJitTimeData = FunctionJITTimeInfo::GetNext(inlineeJitTimeData);
    } while (inlineeJitTimeData != (FunctionJITTimeInfo *)0x0);
  }
  return;
}

Assistant:

void Inline::FillInlineesDataArrayUsingFixedMethods(
    const FunctionJITTimeInfo* inlineeJitTimeData,
        __inout_ecount(inlineesDataArrayLength) const FunctionJITTimeInfo ** inlineesDataArray,
        uint inlineesDataArrayLength,
        __inout_ecount(cachedFixedInlineeCount) FixedFieldInfo* fixedFieldInfoArray,
        uint16 cachedFixedInlineeCount
        )
{
    AnalysisAssert(cachedFixedInlineeCount <= inlineesDataArrayLength);

    JITTimeFunctionBody* inlineeFuncBody = nullptr;
    while (inlineeJitTimeData)
    {
        if (inlineeJitTimeData->HasBody())
        {
             inlineeFuncBody = inlineeJitTimeData->GetBody();
            if (!PHASE_OFF(Js::PolymorphicInlinePhase, inlineeJitTimeData) && !PHASE_OFF(Js::PolymorphicInlineFixedMethodsPhase, inlineeJitTimeData))
            {
                const FunctionJITTimeInfo * jitTimeData = inlineeJitTimeData->GetJitTimeDataFromFunctionInfoAddr(inlineeJitTimeData->GetFunctionInfoAddr());
                if (jitTimeData)
                {
                    for (uint16 i = 0; i < cachedFixedInlineeCount; i++)
                    {
                        if (inlineeJitTimeData->GetFunctionInfoAddr() == fixedFieldInfoArray[i].GetFuncInfoAddr())
                        {
                            inlineesDataArray[i] = inlineeJitTimeData->GetJitTimeDataFromFunctionInfoAddr(inlineeJitTimeData->GetFunctionInfoAddr());
                            break;
                        }
                    }
                }
                else
                {
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
                    POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Missing jit time data skipped inlinee\tInlinee: %s (%s)\n"),
                                inlineeFuncBody->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer));
                }
            }
        }
        inlineeJitTimeData = inlineeJitTimeData->GetNext();
    }
}